

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Fire_PDU::Decode(Fire_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  Descriptor *pDVar1;
  KUINT16 KVar2;
  MunitionDescriptor *pMVar3;
  long lVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  allocator<char> local_51;
  KString local_50;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar2 < 0x60) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Decode",&local_51);
    KException::KException(this_00,&local_50,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Warfare_Header::Decode(&this->super_Warfare_Header,stream,ignoreHeader);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32FireMissionIndex);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Location,stream);
  if ((this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion < 7) {
    if ((this->m_pDescriptor).m_pRef != (Descriptor *)0x0) goto LAB_00172948;
    pMVar3 = (MunitionDescriptor *)operator_new(0x20);
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor(pMVar3);
    local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0021ca98;
    local_50._M_string_length = (size_type)pMVar3;
    local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
  }
  else {
    pDVar1 = (this->m_pDescriptor).m_pRef;
    if (((this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 1) == 0) {
      if (pDVar1 != (Descriptor *)0x0) {
        lVar4 = __dynamic_cast(pDVar1,&DATA_TYPE::Descriptor::typeinfo,
                               &DATA_TYPE::MunitionDescriptor::typeinfo,0);
        if (lVar4 != 0) goto LAB_00172948;
      }
      pMVar3 = (MunitionDescriptor *)operator_new(0x20);
      DATA_TYPE::MunitionDescriptor::MunitionDescriptor(pMVar3);
    }
    else {
      if (pDVar1 != (Descriptor *)0x0) goto LAB_00172948;
      pMVar3 = (MunitionDescriptor *)operator_new(0x18);
      DATA_TYPE::Descriptor::Descriptor((Descriptor *)pMVar3);
    }
    local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0021ca98;
    local_50._M_string_length = (size_type)pMVar3;
    local_50.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(undefined2 *)local_50.field_2._M_allocated_capacity = 1;
  }
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=
            (&this->m_pDescriptor,(KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)&local_50);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr
            ((KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)&local_50);
LAB_00172948:
  pDVar1 = (this->m_pDescriptor).m_pRef;
  (*(pDVar1->super_DataTypeBase)._vptr_DataTypeBase[3])(pDVar1,stream);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Velocity,stream);
  KDataStream::Read<float>(stream,(float *)&this->m_f32Range);
  return;
}

Assistant:

void Fire_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < FIRE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Warfare_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32FireMissionIndex
           >> KDIS_STREAM m_Location;

    #if DIS_VERSION < 7

    if( !m_pDescriptor.GetPtr() )
    {
        m_pDescriptor = DescPtr( new MunitionDescriptor() );
    }

    #else

    // If the protocol version is not 7 then treat it as a MunitionDesc
    if( m_ui8ProtocolVersion < 7 )
    {
        if( !m_pDescriptor.GetPtr() )
        {
            m_pDescriptor = DescPtr( new MunitionDescriptor() );
        }
    }
    else // DIS 7
    {
        if( m_PDUStatusUnion.m_ui8PDUStatusFTI == MunitionFTI )
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new MunitionDescriptor() );
            }
        }
        else
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExpendableDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExpendableDescriptor() );
            }
        }
    }
    #endif

    m_pDescriptor->Decode( stream );

    stream >> KDIS_STREAM m_Velocity
           >> m_f32Range;
}